

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent_peer_allocator_interface::torrent_peer_allocator_interface
          (torrent_peer_allocator_interface *this)

{
  torrent_peer_allocator_interface *this_local;
  
  this->_vptr_torrent_peer_allocator_interface = (_func_int **)&PTR___cxa_pure_virtual_00b8fb10;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT torrent_peer_allocator_interface
	{
		enum peer_type_t
		{
			ipv4_peer_type,
			ipv6_peer_type,
			i2p_peer_type,
			rtc_peer_type
		};

		virtual torrent_peer* allocate_peer_entry(int type) = 0;
		virtual void free_peer_entry(torrent_peer* p) = 0;
	protected:
		~torrent_peer_allocator_interface() {}
	}